

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O3

void __thiscall
PriorityBranchGroup::PriorityBranchGroup
          (PriorityBranchGroup *this,vec<Branching_*> *_x,VarBranch vb)

{
  (this->super_BranchGroup).super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020f7b8;
  vec<Branching*>::vec<Branching*>((vec<Branching*> *)&(this->super_BranchGroup).x,_x);
  (this->super_BranchGroup).var_branch = vb;
  (this->super_BranchGroup).terminal = false;
  (this->super_BranchGroup).fin = 0;
  (this->super_BranchGroup).cur = -1;
  (this->super_BranchGroup).moves.sz = 0;
  (this->super_BranchGroup).moves.cap = 0;
  (this->super_BranchGroup).moves.data = (int *)0x0;
  (this->super_BranchGroup).super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020f7e8;
  (this->annotations).sz = 0;
  (this->annotations).cap = 0;
  (this->annotations).data = (Branching **)0x0;
  return;
}

Assistant:

PriorityBranchGroup::PriorityBranchGroup(vec<Branching*>& _x, VarBranch vb) : BranchGroup(_x, vb) {}